

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimer.cpp
# Opt level: O0

Duration QTimer::from_msecs(milliseconds ms)

{
  bool bVar1;
  long in_FS_OFFSET;
  rep r;
  long *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  QMessageLogger *in_stack_ffffffffffffffd0;
  undefined1 *local_20;
  duration<long,_std::ratio<1L,_1000L>_> local_18;
  rep local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_18);
  bVar1 = qMulOverflow<1000000L,_long>
                    (CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
  if (bVar1) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
               (char *)in_stack_ffffffffffffffb8);
    QMessageLogger::warning
              ((QMessageLogger *)&stack0xffffffffffffffc0,
               "QTimer::singleShot(std::chrono::milliseconds, ...): interval argument overflowed when converted to nanoseconds."
              );
    local_10 = (rep)std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::max();
  }
  else {
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,void>
              ((duration<long,std::ratio<1l,1000000000l>> *)&local_10,(long *)&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (Duration)local_10;
  }
  __stack_chk_fail();
}

Assistant:

QAbstractEventDispatcher::Duration // statically asserts that Duration is nanoseconds
QTimer::from_msecs(std::chrono::milliseconds ms)
{
    using Duration = QAbstractEventDispatcher::Duration;

    using namespace std::chrono;
    using ratio = std::ratio_divide<std::milli, Duration::period>;
    static_assert(ratio::den == 1);

    Duration::rep r;
    if (qMulOverflow<ratio::num>(ms.count(), &r)) {
        qWarning("QTimer::singleShot(std::chrono::milliseconds, ...): "
                 "interval argument overflowed when converted to nanoseconds.");
        return Duration::max();
    }
    return Duration{r};
}